

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmdynfunc.cpp
# Opt level: O1

int __thiscall
CVmDynamicFunc::index_val_q
          (CVmDynamicFunc *this,vm_val_t *result,vm_obj_id_t self,vm_val_t *index_val)

{
  char *pcVar1;
  anon_union_8_8_cb74652f_for_val aVar2;
  
  if ((index_val->typ == VM_INT) && ((index_val->val).obj == 1)) {
    pcVar1 = (this->super_CVmObject).ext_;
    aVar2 = *(anon_union_8_8_cb74652f_for_val *)(pcVar1 + 0x18);
    *(undefined8 *)result = *(undefined8 *)(pcVar1 + 0x10);
    result->val = aVar2;
    return 1;
  }
  err_throw(0x7df);
}

Assistant:

int CVmDynamicFunc::index_val_q(VMG_ vm_val_t *result,
                                vm_obj_id_t self,
                                const vm_val_t *index_val)
{
    /* check the type */
    if (index_val->typ == VM_INT)
    {
        /* it's an integer index - check the value */
        switch (index_val->val.intval)
        {
        case 1:
            /* return our method context */
            *result = get_ext()->method_ctx;
            return TRUE;

        default:
            /* other values are not allowed */
            break;
        }
    }

    /* if we didn't handle it already, it's an invalid index */
    err_throw(VMERR_INDEX_OUT_OF_RANGE);
    AFTER_ERR_THROW(return TRUE;)
}